

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

void jsoncons::detail::dump_buffer<jsoncons::string_sink<std::__cxx11::string>>
               (char *buffer,size_t length,char decimal_point,
               string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *result)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  
  pbVar1 = (byte *)(buffer + length);
  if (length == 0) {
    return;
  }
  if (0 < (long)length) {
    bVar3 = true;
    do {
      bVar2 = *buffer;
      if (bVar2 - 0x30 < 10) {
LAB_001db8db:
        std::__cxx11::string::push_back((char)result->buf_ptr);
      }
      else {
        if (0x44 < bVar2) {
          if ((bVar2 != 0x65) && (bVar2 != 0x45)) goto LAB_001db912;
LAB_001db90d:
          bVar3 = false;
          goto LAB_001db8db;
        }
        if ((bVar2 == 0x2b) || (bVar2 == 0x2d)) goto LAB_001db8db;
LAB_001db912:
        if (bVar2 == decimal_point) goto LAB_001db90d;
      }
      buffer = (char *)((byte *)buffer + 1);
    } while (buffer < pbVar1);
    if (!bVar3) {
      return;
    }
  }
  std::__cxx11::string::push_back((char)result->buf_ptr);
  std::__cxx11::string::push_back((char)result->buf_ptr);
  return;
}

Assistant:

void dump_buffer(const char *buffer, std::size_t length, char decimal_point, Result& result)
    {
        const char *sbeg = buffer;
        const char *send = sbeg + length;

        if (sbeg != send)
        {
            bool needs_dot = true;
            for (const char* q = sbeg; q < send; ++q)
            {
                switch (*q)
                {
                case '-':
                case '0':
                case '1':
                case '2':
                case '3':
                case '4':
                case '5':
                case '6':
                case '7':
                case '8':
                case '9':
                case '+':
                    result.push_back(*q);
                    break;
                case 'e':
                case 'E':
                    result.push_back('e');
                    needs_dot = false;
                    break;
                default:
                    if (*q == decimal_point)
                    {
                        needs_dot = false;
                        result.push_back('.');
                    }
                    break;
                }
            }
            if (needs_dot)
            {
                result.push_back('.');
                result.push_back('0');
            }
        }
    }